

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow_p.h
# Opt level: O1

int __thiscall QMdiSubWindowPrivate::titleBarHeight(QMdiSubWindowPrivate *this)

{
  QWidget *this_00;
  QWidget *this_01;
  bool bVar1;
  int iVar2;
  QStyle *pQVar3;
  int iVar4;
  long in_FS_OFFSET;
  QStyleOptionTitleBar options;
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 *local_78;
  QPalettePrivate *pQStack_70;
  undefined1 *local_68;
  QObject *pQStack_60;
  undefined1 *local_58;
  QArrayData *pQStack_50;
  char16_t *local_48;
  undefined1 *puStack_40;
  QIcon local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = 0;
  if ((*(long *)&(this->super_QWidgetPrivate).field_0x10 != 0) &&
     (this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8, iVar4 = 0,
     ((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
      super_QFlagsStorage<Qt::WindowType>.i & 0x800) == 0)) {
    bVar1 = QWidget::isMaximized(this_00);
    if (bVar1) {
      bVar1 = drawTitleBarWhenMaximized(this);
      if (!bVar1) goto LAB_0045b45e;
    }
    local_38.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_70 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    titleBarOptions((QStyleOptionTitleBar *)local_98,this);
    iVar4 = (uStack_80._4_4_ - local_88._4_4_) + 1;
    this_01 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    pQVar3 = QWidget::style(this_01);
    iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x1a,local_98,this_01,0);
    if (iVar2 == 0) {
      bVar1 = QWidget::isMinimized(this_00);
      iVar4 = iVar4 + (uint)bVar1 * 4 + 4;
    }
    QIcon::~QIcon(&local_38);
    if (pQStack_50 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_50->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQStack_50,2,0x10);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)local_98);
  }
LAB_0045b45e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

inline int titleBarHeight() const
    {
        Q_Q(const QMdiSubWindow);
        if (!parent || q->windowFlags() & Qt::FramelessWindowHint
            || (q->isMaximized() && !drawTitleBarWhenMaximized())) {
            return 0;
        }
        QStyleOptionTitleBar options = titleBarOptions();
        int height = options.rect.height();
        if (hasBorder(options))
            height += q->isMinimized() ? 8 : 4;
        return height;
    }